

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O3

void __thiscall Restaurant::~Restaurant(Restaurant *this)

{
  pointer ppTVar1;
  pointer ppBVar2;
  pointer pcVar3;
  Table **table;
  pointer ppTVar4;
  pointer ppBVar5;
  
  this->_vptr_Restaurant = (_func_int **)&PTR__Restaurant_00110d90;
  ppTVar1 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar4 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar4 != ppTVar1; ppTVar4 = ppTVar4 + 1) {
    if (*ppTVar4 != (Table *)0x0) {
      (*(*ppTVar4)->_vptr_Table[1])();
    }
  }
  ppBVar2 = (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar5 = (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar5 != ppBVar2; ppBVar5 = ppBVar5 + 1
      ) {
    if (*ppBVar5 != (BaseAction *)0x0) {
      (*(*ppBVar5)->_vptr_BaseAction[4])();
    }
  }
  ppTVar4 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar4) {
    (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar4;
  }
  ppBVar5 = (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar5) {
    (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppBVar5;
  }
  std::vector<Dish,_std::allocator<Dish>_>::clear(&this->menu);
  pcVar3 = (this->newMsg)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->newMsg).field_2) {
    operator_delete(pcVar3);
  }
  ppBVar5 = (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar5 != (pointer)0x0) {
    operator_delete(ppBVar5);
  }
  std::vector<Dish,_std::allocator<Dish>_>::~vector(&this->menu);
  ppTVar4 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar4 != (pointer)0x0) {
    operator_delete(ppTVar4);
    return;
  }
  return;
}

Assistant:

Restaurant::~Restaurant()
{
    for (auto &table : tables) {
        delete table;
    }
    for (auto &j : actionsLog) {
        delete j;
    }
    tables.clear();
    actionsLog.clear();
    menu.clear();
}